

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializePayload0.cpp
# Opt level: O2

void trackerboy::deserializePayload0TU::readListIndex<trackerboy::Instrument>
               (InputBlock *block,size_t count,Table<trackerboy::Instrument> *list)

{
  Instrument *this;
  InputBlock *block_00;
  bool bVar1;
  uint8_t id;
  byte local_51;
  string local_50;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    InputBlock::read<unsigned_char>(block,&local_51);
    this = Table<trackerboy::Instrument>::insert(list,(uint)local_51);
    deserializeString_abi_cxx11_(&local_50,(deserializePayload0TU *)block,block_00);
    Named::setName(&this->super_Named,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void readListIndex(InputBlock &block, size_t count, Table<T> &list) {
    while (count--) {
        uint8_t id;
        block.read(id);
        auto item = list.insert(id);
        item->setName(TU::deserializeString(block));
    }
}